

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FieldDescriptor *pFVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view end_varname_08;
  string_view end_varname_09;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar3;
  bool bVar4;
  JavaType JVar5;
  Options *pOVar6;
  undefined1 in_R8B;
  undefined1 uVar7;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_718;
  string_view local_710;
  string_view local_700;
  string_view local_6f0;
  FieldDescriptor local_6e0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_688;
  basic_string_view<char,_std::char_traits<char>_> local_680;
  string_view local_670;
  string_view local_660;
  FieldDescriptor local_650;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_5f8;
  basic_string_view<char,_std::char_traits<char>_> local_5f0;
  string_view local_5e0;
  string_view local_5d0;
  FieldDescriptor local_5c0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_568;
  basic_string_view<char,_std::char_traits<char>_> local_560;
  string_view local_550;
  string_view local_540;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_528;
  string_view local_520;
  string_view local_510;
  string_view local_500;
  FieldDescriptor local_4f0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_498;
  basic_string_view<char,_std::char_traits<char>_> local_490;
  string_view local_480;
  string_view local_470;
  FieldDescriptor local_460;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_408;
  basic_string_view<char,_std::char_traits<char>_> local_400;
  string_view local_3f0;
  string_view local_3e0;
  FieldDescriptor local_3d0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_378;
  basic_string_view<char,_std::char_traits<char>_> local_370;
  string_view local_360;
  string_view local_350;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_338;
  string_view local_330;
  string_view local_320;
  string_view local_310;
  FieldDescriptor local_300;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  string_view local_290;
  string_view local_280;
  FieldDescriptor local_270;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  string_view local_200;
  string_view local_1f0;
  FieldDescriptor local_1e0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  string_view local_170;
  string_view local_160;
  FieldDescriptor *local_150;
  FieldDescriptor *value;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  string_view local_128;
  string_view local_118;
  FieldDescriptor local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string_view local_98;
  string_view local_88 [2];
  FieldDescriptor local_68;
  Printer *printer_local;
  ImmutableMapFieldLiteGenerator *this_local;
  
  pPVar1 = (Printer *)this->descriptor_;
  local_68.field_20 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27)printer;
  printer_local = (Printer *)this;
  pOVar6 = Context::options(this->context_);
  Options::Options((Options *)&local_68,pOVar6);
  WriteFieldDocComment((java *)printer,pPVar1,&local_68,(Options *)0x0,(bool)in_R8B);
  Options::~Options((Options *)&local_68);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,"$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_88[0]);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
  end_varname_09._M_str = local_a8._M_str;
  end_varname_09._M_len = local_a8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_98,end_varname_09,pFVar2,local_b0);
  aVar3 = local_68.field_20;
  uVar7 = SUB81(local_a8._M_str,0);
  pPVar1 = (Printer *)this->descriptor_;
  pOVar6 = Context::options(this->context_);
  Options::Options((Options *)&local_108,pOVar6);
  WriteFieldDocComment
            ((java *)aVar3.default_value_enum_,pPVar1,&local_108,(Options *)0x0,(bool)uVar7);
  Options::~Options((Options *)&local_108);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,
             "$deprecation$boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key);\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)aVar3.default_value_enum_,&this->variables_,local_118);
  aVar3 = local_68.field_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar2 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  end_varname_08._M_str = local_138._M_str;
  end_varname_08._M_len = local_138._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            ((Printer *)aVar3.default_value_enum_,local_128,end_varname_08,pFVar2,local_140);
  uVar7 = SUB81(local_138._M_str,0);
  local_150 = MapValueField(this->descriptor_);
  JVar5 = GetJavaType(local_150);
  if (JVar5 == JAVATYPE_ENUM) {
    pOVar6 = Context::options(this->context_);
    aVar3 = local_68.field_20;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_160,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$();\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_160);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_180,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_188);
      end_varname_07._M_str = local_180._M_str;
      end_varname_07._M_len = local_180._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_170,end_varname_07,pFVar2,local_188);
      uVar7 = SUB81(local_180._M_str,0);
    }
    aVar3 = local_68.field_20;
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_1e0,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_1e0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_1e0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,
               "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$();\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_1f0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_218);
    end_varname_06._M_str = local_210._M_str;
    end_varname_06._M_len = local_210._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_200,end_varname_06,pFVar2,local_218);
    aVar3 = local_68.field_20;
    uVar7 = SUB81(local_210._M_str,0);
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_270,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_270,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_270);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_280,
               "$deprecation$$value_enum_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type_pass_through_nullness$         defaultValue);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_280);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_2a8);
    end_varname_05._M_str = local_2a0._M_str;
    end_varname_05._M_len = local_2a0._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_290,end_varname_05,pFVar2,local_2a8);
    aVar3 = local_68.field_20;
    uVar7 = SUB81(local_2a0._M_str,0);
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_300,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_300,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_300);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_310,
               "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_310);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_320,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_338);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_320,local_330,pFVar2,local_338);
    bVar4 = SupportUnknownEnumValue(local_150);
    aVar3 = local_68.field_20;
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_350,
                 "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$Value$}$();\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_350);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_360,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_378);
      end_varname_04._M_str = local_370._M_str;
      end_varname_04._M_len = local_370._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_360,end_varname_04,pFVar2,local_378);
      aVar3 = local_68.field_20;
      uVar7 = SUB81(local_370._M_str,0);
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_3d0,pOVar6);
      WriteFieldDocComment
                ((java *)aVar3.default_value_enum_,pPVar1,&local_3d0,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_3d0);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3e0,
                 "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$ValueMap$}$();\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_3e0);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_400,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_408);
      end_varname_03._M_str = local_400._M_str;
      end_varname_03._M_len = local_400._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_3f0,end_varname_03,pFVar2,local_408);
      aVar3 = local_68.field_20;
      uVar7 = SUB81(local_400._M_str,0);
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_460,pOVar6);
      WriteFieldDocComment
                ((java *)aVar3.default_value_enum_,pPVar1,&local_460,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_460);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_470,
                 "$deprecation$\n$value_type_pass_through_nullness$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue);\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_470);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_490,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_498);
      end_varname_02._M_str = local_490._M_str;
      end_varname_02._M_len = local_490._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_480,end_varname_02,pFVar2,local_498);
      aVar3 = local_68.field_20;
      uVar7 = SUB81(local_490._M_str,0);
      pPVar1 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_4f0,pOVar6);
      WriteFieldDocComment
                ((java *)aVar3.default_value_enum_,pPVar1,&local_4f0,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_4f0);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_500,
                 "$deprecation$\n$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key);\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_500);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_510,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_520,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_528);
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_510,local_520,pFVar2,local_528);
    }
  }
  else {
    pOVar6 = Context::options(this->context_);
    aVar3 = local_68.field_20;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_540,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$$}$();\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)aVar3.default_value_enum_,&this->variables_,local_540);
      aVar3 = local_68.field_20;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_550,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_560,"}");
      pFVar2 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_568);
      end_varname_01._M_str = local_560._M_str;
      end_varname_01._M_len = local_560._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                ((Printer *)aVar3.default_value_enum_,local_550,end_varname_01,pFVar2,local_568);
      uVar7 = SUB81(local_560._M_str,0);
    }
    aVar3 = local_68.field_20;
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_5c0,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_5c0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_5c0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5d0,
               "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$Map$}$();\n")
    ;
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_5d0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5e0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5f0,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_5f8);
    end_varname_00._M_str = local_5f0._M_str;
    end_varname_00._M_len = local_5f0._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_5e0,end_varname_00,pFVar2,local_5f8);
    aVar3 = local_68.field_20;
    uVar7 = SUB81(local_5f0._M_str,0);
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_650,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_650,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_650);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_660,
               "$deprecation$\n$value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_660);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_670,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_680,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_688);
    end_varname._M_str = local_680._M_str;
    end_varname._M_len = local_680._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_670,end_varname,pFVar2,local_688);
    aVar3 = local_68.field_20;
    uVar7 = SUB81(local_680._M_str,0);
    pPVar1 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_6e0,pOVar6);
    WriteFieldDocComment
              ((java *)aVar3.default_value_enum_,pPVar1,&local_6e0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_6e0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_6f0,
               "$deprecation$\n$value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)aVar3.default_value_enum_,&this->variables_,local_6f0);
    aVar3 = local_68.field_20;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_700,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_710,"}");
    pFVar2 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_718);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              ((Printer *)aVar3.default_value_enum_,local_700,local_710,pFVar2,local_718);
  }
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$boolean ${$contains$capitalized_name$$}$(\n"
                 "    $key_type$ key);\n");
  printer->Annotate("{", "}", descriptor_);
  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Deprecated\n"
                     "java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
                     "${$get$capitalized_name$$}$();\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$$value_enum_type_pass_through_nullness$ "
                   "${$get$capitalized_name$OrDefault$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_enum_type_pass_through_nullness$ "
                   "        defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(value)) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "java.util.Map<$type_parameters$>\n"
          "${$get$capitalized_name$Value$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$java.util.Map<$type_parameters$>\n"
                     "${$get$capitalized_name$ValueMap$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type_pass_through_nullness$ "
                     "${$get$capitalized_name$ValueOrDefault$}$(\n"
                     "    $key_type$ key,\n"
                     "    $value_type_pass_through_nullness$ defaultValue);\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n"
                     "    $key_type$ key);\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Deprecated\n"
                     "java.util.Map<$type_parameters$>\n"
                     "${$get$capitalized_name$$}$();\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$java.util.Map<$type_parameters$>\n"
                   "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type_pass_through_nullness$ "
                   "${$get$capitalized_name$OrDefault$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_type_pass_through_nullness$ defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
                   "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
  }
}